

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O2

TValue * lj_meta_arith(lua_State *L,TValue *ra,cTValue *rb,cTValue *rc,BCReg op)

{
  cTValue *pcVar1;
  cTValue *pcVar2;
  TValue *pTVar3;
  MMS mm;
  uint64_t uVar4;
  TValue tempb;
  TValue tempc;
  TValue local_40;
  TValue local_38;
  
  mm = (MMS)(lj_bc_mode[op] >> 0xb);
  pcVar1 = str2num(rb,&local_40);
  if ((pcVar1 != (cTValue *)0x0) && (pcVar2 = str2num(rc,&local_38), pcVar2 != (cTValue *)0x0)) {
    uVar4 = lj_vm_foldarith(pcVar1->u64,pcVar2->u64,mm - MM_add);
    ra->u64 = uVar4;
    return (TValue *)0x0;
  }
  pcVar1 = lj_meta_lookup(L,rb,mm);
  if (((pcVar1->field_2).it == 0xffffffff) &&
     (pcVar1 = lj_meta_lookup(L,rc,mm), (pcVar1->field_2).it == 0xffffffff)) {
    pcVar1 = str2num(rb,&local_40);
    if (pcVar1 == (cTValue *)0x0) {
      rc = rb;
    }
    lj_err_optype(L,rc,LJ_ERR_OPARITH);
  }
  pTVar3 = mmcall(L,lj_cont_ra,pcVar1,rb,rc);
  return pTVar3;
}

Assistant:

TValue *lj_meta_arith(lua_State *L, TValue *ra, cTValue *rb, cTValue *rc,
		      BCReg op)
{
  MMS mm = bcmode_mm(op);
  TValue tempb, tempc;
  cTValue *b, *c;
  if ((b = str2num(rb, &tempb)) != NULL &&
      (c = str2num(rc, &tempc)) != NULL) {  /* Try coercion first. */
    setnumV(ra, lj_vm_foldarith(numV(b), numV(c), (int)mm-MM_add));
    return NULL;
  } else {
    cTValue *mo = lj_meta_lookup(L, rb, mm);
    if (tvisnil(mo)) {
      mo = lj_meta_lookup(L, rc, mm);
      if (tvisnil(mo)) {
	if (str2num(rb, &tempb) == NULL) rc = rb;
	lj_err_optype(L, rc, LJ_ERR_OPARITH);
	return NULL;  /* unreachable */
      }
    }
    return mmcall(L, lj_cont_ra, mo, rb, rc);
  }
}